

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O2

void pbrt::
     LogFatal<char_const(&)[18],char_const(&)[5],char_const(&)[18],pbrt::Vector3<float>&,char_const(&)[5],pbrt::Vector3<float>&>
               (LogLevel level,char *file,int line,char *fmt,char (*args) [18],char (*args_1) [5],
               char (*args_2) [18],Vector3<float> *args_3,char (*args_4) [5],Vector3<float> *args_5)

{
  Vector3<float> *in_stack_ffffffffffffffb8;
  string local_40;
  
  StringPrintf<char_const(&)[18],char_const(&)[5],char_const(&)[18],pbrt::Vector3<float>&,char_const(&)[5],pbrt::Vector3<float>&>
            (&local_40,(pbrt *)fmt,*args,(char (*) [18])args_1,(char (*) [5])args_2,
             (char (*) [18])args_3,(Vector3<float> *)args_4,(char (*) [5])args_5,
             in_stack_ffffffffffffffb8);
  LogFatal(level,file,line,local_40._M_dataplus._M_p);
}

Assistant:

inline void LogFatal(LogLevel level, const char *file, int line, const char *fmt,
                     Args &&... args) {
#ifdef PBRT_IS_GPU_CODE
    LogFatal(level, file, line, fmt);  // just the format string #yolo
#else
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    LogFatal(level, file, line, s.c_str());
#endif
}